

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void ** ialloc(mstate m,size_t n_elements,size_t *sizes,int opts,void **chunks)

{
  uint uVar1;
  void **ppvVar2;
  void *__s;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  void *local_a8;
  size_t array_chunk_size;
  size_t i;
  size_t size;
  flag_t was_enabled;
  mchunkptr array_chunk;
  void **marray;
  size_t remainder_size;
  mchunkptr p;
  void *mem;
  size_t array_size;
  size_t contents_size;
  size_t element_size;
  void **chunks_local;
  int opts_local;
  size_t *sizes_local;
  size_t n_elements_local;
  mstate m_local;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (chunks == (void **)0x0) {
    if (n_elements == 0) {
      ppvVar2 = (void **)mspace_malloc(m,0);
      return ppvVar2;
    }
    array_chunk = (mchunkptr)0x0;
    if (n_elements << 3 < 0x17) {
      local_a8 = (void *)0x20;
    }
    else {
      local_a8 = (void *)(n_elements * 8 + 0x17 & 0xfffffffffffffff0);
    }
    mem = local_a8;
  }
  else {
    if (n_elements == 0) {
      return chunks;
    }
    mem = (void *)0x0;
    array_chunk = (mchunkptr)chunks;
  }
  if ((opts & 1U) == 0) {
    contents_size = 0;
    array_size = 0;
    for (array_chunk_size = 0; array_chunk_size != n_elements;
        array_chunk_size = array_chunk_size + 1) {
      if (sizes[array_chunk_size] < 0x17) {
        local_b8 = 0x20;
      }
      else {
        local_b8 = sizes[array_chunk_size] + 0x17 & 0xfffffffffffffff0;
      }
      array_size = local_b8 + array_size;
    }
  }
  else {
    if (*sizes < 0x17) {
      local_b0 = 0x20;
    }
    else {
      local_b0 = *sizes + 0x17 & 0xfffffffffffffff0;
    }
    contents_size = local_b0;
    array_size = n_elements * local_b0;
  }
  uVar1 = m->mflags;
  m->mflags = m->mflags & 0xfffffffe;
  __s = mspace_malloc(m,(long)mem + (array_size - 8));
  if ((uVar1 & 1) != 0) {
    m->mflags = m->mflags | 1;
  }
  if (__s == (void *)0x0) {
    m_local = (mstate)0x0;
  }
  else {
    remainder_size = (long)__s - 0x10;
    marray = (void **)(*(ulong *)((long)__s + -8) & 0xfffffffffffffff8);
    if ((opts & 2U) != 0) {
      memset(__s,0,(long)marray + (-8 - (long)mem));
    }
    if (array_chunk == (mchunkptr)0x0) {
      array_chunk = (mchunkptr)(remainder_size + array_size + 0x10);
      *(size_t *)(remainder_size + array_size + 8) = (long)marray - array_size | 3;
      marray = (void **)array_size;
    }
    for (array_chunk_size = 0; (&array_chunk->prev_foot)[array_chunk_size] = remainder_size + 0x10,
        array_chunk_size != n_elements - 1; array_chunk_size = array_chunk_size + 1) {
      if (contents_size == 0) {
        if (sizes[array_chunk_size] < 0x17) {
          local_c0 = 0x20;
        }
        else {
          local_c0 = sizes[array_chunk_size] + 0x17 & 0xfffffffffffffff0;
        }
        i = local_c0;
      }
      else {
        i = contents_size;
      }
      marray = (void **)((long)marray - i);
      *(size_t *)(remainder_size + 8) = i | 3;
      remainder_size = remainder_size + i;
    }
    *(ulong *)(remainder_size + 8) = (ulong)marray | 3;
    m_local = (mstate)array_chunk;
  }
  return (void **)m_local;
}

Assistant:

static void** ialloc(mstate m,
                     size_t n_elements,
                     size_t* sizes,
                     int opts,
                     void* chunks[]) {

  size_t    element_size;   /* chunksize of each element, if all same */
  size_t    contents_size;  /* total size of elements */
  size_t    array_size;     /* request size of pointer array */
  void*     mem;            /* malloced aggregate space */
  mchunkptr p;              /* corresponding chunk */
  size_t    remainder_size; /* remaining bytes while splitting */
  void**    marray;         /* either "chunks" or malloced ptr array */
  mchunkptr array_chunk;    /* chunk for malloced ptr array */
  flag_t    was_enabled;    /* to disable mmap */
  size_t    size;
  size_t    i;

  ensure_initialization();
  /* compute array length, if needed */
  if (chunks != 0) {
    if (n_elements == 0)
      return chunks; /* nothing to do */
    marray = chunks;
    array_size = 0;
  }
  else {
    /* if empty req, must still return chunk representing empty array */
    if (n_elements == 0)
      return (void**)internal_malloc(m, 0);
    marray = 0;
    array_size = request2size(n_elements * (sizeof(void*)));
  }

  /* compute total element size */
  if (opts & 0x1) { /* all-same-size */
    element_size = request2size(*sizes);
    contents_size = n_elements * element_size;
  }
  else { /* add up all the sizes */
    element_size = 0;
    contents_size = 0;
    for (i = 0; i != n_elements; ++i)
      contents_size += request2size(sizes[i]);
  }

  size = contents_size + array_size;

  /*
     Allocate the aggregate chunk.  First disable direct-mmapping so
     malloc won't use it, since we would not be able to later
     free/realloc space internal to a segregated mmap region.
  */
  was_enabled = use_mmap(m);
  disable_mmap(m);
  mem = internal_malloc(m, size - CHUNK_OVERHEAD);
  if (was_enabled)
    enable_mmap(m);
  if (mem == 0)
    return 0;

  if (PREACTION(m)) return 0;
  p = mem2chunk(mem);
  remainder_size = chunksize(p);

  assert(!is_mmapped(p));

  if (opts & 0x2) {       /* optionally clear the elements */
    memset((size_t*)mem, 0, remainder_size - SIZE_T_SIZE - array_size);
  }

  /* If not provided, allocate the pointer array as final part of chunk */
  if (marray == 0) {
    size_t  array_chunk_size;
    array_chunk = chunk_plus_offset(p, contents_size);
    array_chunk_size = remainder_size - contents_size;
    marray = (void**) (chunk2mem(array_chunk));
    set_size_and_pinuse_of_inuse_chunk(m, array_chunk, array_chunk_size);
    remainder_size = contents_size;
  }

  /* split out elements */
  for (i = 0; ; ++i) {
    marray[i] = chunk2mem(p);
    if (i != n_elements-1) {
      if (element_size != 0)
        size = element_size;
      else
        size = request2size(sizes[i]);
      remainder_size -= size;
      set_size_and_pinuse_of_inuse_chunk(m, p, size);
      p = chunk_plus_offset(p, size);
    }
    else { /* the final element absorbs any overallocation slop */
      set_size_and_pinuse_of_inuse_chunk(m, p, remainder_size);
      break;
    }
  }

#if DEBUG
  if (marray != chunks) {
    /* final element must have exactly exhausted chunk */
    if (element_size != 0) {
      assert(remainder_size == element_size);
    }
    else {
      assert(remainder_size == request2size(sizes[i]));
    }
    check_inuse_chunk(m, mem2chunk(marray));
  }
  for (i = 0; i != n_elements; ++i)
    check_inuse_chunk(m, mem2chunk(marray[i]));

#endif /* DEBUG */

  POSTACTION(m);
  return marray;
}